

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_7::Validator::CheckDuplicateExportBindings(Validator *this,Module *module)

{
  anon_class_8_1_8991fb9c local_40;
  DuplicateCallback local_38;
  Module *local_18;
  Module *module_local;
  Validator *this_local;
  
  local_40.this = this;
  local_18 = module;
  module_local = (Module *)this;
  std::
  function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>
  ::
  function<wabt::(anonymous_namespace)::Validator::CheckDuplicateExportBindings(wabt::Module_const*)::__0,void>
            ((function<void(std::pair<std::__cxx11::string_const,wabt::Binding>const&,std::pair<std::__cxx11::string_const,wabt::Binding>const&)>
              *)&local_38,&local_40);
  BindingHash::FindDuplicates(&module->export_bindings,&local_38);
  std::
  function<void_(const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&,_const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::Binding>_&)>
  ::~function(&local_38);
  return;
}

Assistant:

void Validator::CheckDuplicateExportBindings(const Module* module) {
  module->export_bindings.FindDuplicates(
      [this](const BindingHash::value_type& a,
             const BindingHash::value_type& b) {
        // Choose the location that is later in the file.
        const Location& a_loc = a.second.loc;
        const Location& b_loc = b.second.loc;
        const Location& loc = a_loc.line > b_loc.line ? a_loc : b_loc;
        PrintError(&loc, "redefinition of export \"%s\"", a.first.c_str());
      });
}